

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_legacy_regex(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *__haystack;
  char *__format;
  char *flags;
  char *pattern;
  bson_t b;
  bson_error_t error;
  undefined8 uVar5;
  char *local_390;
  char *local_388;
  undefined1 local_380 [232];
  uint local_298;
  uint local_294;
  char local_290 [640];
  
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}",
                              0xffffffffffffffff,&local_298);
  if (cVar1 == '\0') {
    fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x469,"test_bson_json_read_legacy_regex","r",local_290);
    fflush(_stderr);
    abort();
  }
  uVar3 = bson_bcone_magic();
  bcon_extract(local_380,"a",uVar3,10,&local_388,&local_390,0);
  if ((local_388 != "abc") && (iVar2 = strcmp(local_388,"abc"), iVar2 != 0)) {
    __format = "FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n";
    pcVar4 = "abc";
    __haystack = local_388;
LAB_00122837:
    fprintf(_stderr,__format,__haystack,pcVar4);
    abort();
  }
  if ((local_390 != "ix") &&
     (((*local_390 != 'i' || (local_390[1] != 'x')) || (local_390[2] != '\0')))) {
    __format = "FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n";
    pcVar4 = "ix";
    __haystack = local_390;
    goto LAB_00122837;
  }
  bson_destroy(local_380);
  cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$regex\": \"abc\"}}",0xffffffffffffffff,
                              &local_298);
  if (cVar1 != '\0') {
    uVar3 = 0x471;
LAB_001226a5:
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            uVar3,"test_bson_json_read_legacy_regex","!r");
    abort();
  }
  if (local_298 == 1) {
    if (local_294 == 2) {
      __haystack = local_290;
      pcVar4 = strstr(__haystack,"Missing \"$options\" after \"$regex\"");
      if (pcVar4 == (char *)0x0) {
        __format = "FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n";
        pcVar4 = "Missing \"$options\" after \"$regex\"";
        goto LAB_00122837;
      }
      cVar1 = bson_init_from_json(local_380,"{\"a\": {\"$options\": \"ix\"}}",0xffffffffffffffff,
                                  &local_298);
      if (cVar1 != '\0') {
        uVar3 = 0x478;
        goto LAB_001226a5;
      }
      if (local_298 == 1) {
        if (local_294 == 2) {
          pcVar4 = strstr(__haystack,"Missing \"$regex\" after \"$options\"");
          if (pcVar4 != (char *)0x0) {
            return;
          }
          __format = "FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n";
          pcVar4 = "Missing \"$regex\" after \"$options\"";
          goto LAB_00122837;
        }
        uVar3 = 2;
      }
      else {
        uVar3 = 1;
        local_294 = local_298;
      }
      uVar5 = 0x47c;
      goto LAB_001227f6;
    }
    uVar3 = 2;
  }
  else {
    uVar3 = 1;
    local_294 = local_298;
  }
  uVar5 = 0x475;
LAB_001227f6:
  fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_294,"==",uVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_read_legacy_regex");
  abort();
}

Assistant:

static void
test_bson_json_read_legacy_regex (void)
{
   bson_t b;
   bson_error_t error;
   bool r;
   const char *pattern;
   const char *flags;

   r = bson_init_from_json (
      &b, "{\"a\": {\"$regex\": \"abc\", \"$options\": \"ix\"}}", -1, &error);
   ASSERT_OR_PRINT (r, error);
   BCON_EXTRACT (&b, "a", BCONE_REGEX (pattern, flags));
   ASSERT_CMPSTR (pattern, "abc");
   ASSERT_CMPSTR (flags, "ix");

   bson_destroy (&b);

   r = bson_init_from_json (&b, "{\"a\": {\"$regex\": \"abc\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$options\" after \"$regex\"");

   r = bson_init_from_json (&b, "{\"a\": {\"$options\": \"ix\"}}", -1, &error);
   BSON_ASSERT (!r);
   ASSERT_ERROR_CONTAINS (error,
                          BSON_ERROR_JSON,
                          BSON_JSON_ERROR_READ_INVALID_PARAM,
                          "Missing \"$regex\" after \"$options\"");
}